

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

int64_t __thiscall
icu_63::RegexMatcher::start64(RegexMatcher *this,int32_t group,UErrorCode *status)

{
  UVector32 *pUVar1;
  int64_t iVar2;
  int64_t *piVar3;
  
  iVar2 = -1;
  if (U_ZERO_ERROR < *status) {
    return iVar2;
  }
  if (U_ZERO_ERROR < this->fDeferredStatus) {
    *status = this->fDeferredStatus;
    return iVar2;
  }
  if (this->fMatch == '\0') {
    *status = U_REGEX_INVALID_STATE;
    return iVar2;
  }
  if ((-1 < group) && (pUVar1 = this->fPattern->fGroupMap, group <= pUVar1->count)) {
    if (group == 0) {
      piVar3 = &this->fMatchStart;
    }
    else {
      piVar3 = this->fFrame->fExtra + pUVar1->elements[(ulong)(uint)group - 1];
    }
    return *piVar3;
  }
  *status = U_INDEX_OUTOFBOUNDS_ERROR;
  return iVar2;
}

Assistant:

int64_t RegexMatcher::start64(int32_t group, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return -1;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return -1;
    }
    if (fMatch == FALSE) {
        status = U_REGEX_INVALID_STATE;
        return -1;
    }
    if (group < 0 || group > fPattern->fGroupMap->size()) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
        return -1;
    }
    int64_t s;
    if (group == 0) {
        s = fMatchStart;
    } else {
        int32_t groupOffset = fPattern->fGroupMap->elementAti(group-1);
        U_ASSERT(groupOffset < fPattern->fFrameSize);
        U_ASSERT(groupOffset >= 0);
        s = fFrame->fExtra[groupOffset];
    }

    return s;
}